

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

NULLCRef * NULLCVector::VectorNext(NULLCRef *__return_storage_ptr__,vector_iterator *iter)

{
  uint uVar1;
  uint uVar2;
  vector *pvVar3;
  char *pcVar4;
  
  pvVar3 = iter->arr;
  if (pvVar3->flags == 0) {
    __return_storage_ptr__->typeID = pvVar3->elemType;
  }
  else {
    uVar1 = nullcGetSubType(0);
    pvVar3 = iter->arr;
    uVar2 = pvVar3->flags;
    __return_storage_ptr__->typeID = uVar1;
    if (uVar2 != 0) {
      uVar2 = iter->pos;
      pcVar4 = *(char **)((pvVar3->data).ptr + (ulong)uVar2 * 8);
      goto LAB_0020ee4e;
    }
  }
  uVar2 = iter->pos;
  pcVar4 = (pvVar3->data).ptr + pvVar3->elemSize * uVar2;
LAB_0020ee4e:
  __return_storage_ptr__->ptr = pcVar4;
  iter->pos = uVar2 + 1;
  return __return_storage_ptr__;
}

Assistant:

NULLCRef VectorNext(vector_iterator* iter)
	{
		NULLCRef ret;
		ret.typeID = (iter->arr->flags ? nullcGetSubType(iter->arr->elemType) : iter->arr->elemType);
		ret.ptr =  iter->arr->flags ? ((char**)iter->arr->data.ptr)[iter->pos] : iter->arr->data.ptr + iter->arr->elemSize * iter->pos;
		iter->pos++;
		return ret;
	}